

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

int color_count_comp(void *c1,void *c2)

{
  int iVar1;
  
  iVar1 = -1;
  if ((*(int *)((long)c1 + 4) <= *(int *)((long)c2 + 4)) &&
     (iVar1 = 1, *(int *)((long)c2 + 4) <= *(int *)((long)c1 + 4))) {
    iVar1 = (uint)(*c2 <= *c1) * 2 + -1;
  }
  return iVar1;
}

Assistant:

static int color_count_comp(const void *c1, const void *c2) {
  const struct ColorCount *color_count1 = (const struct ColorCount *)c1;
  const struct ColorCount *color_count2 = (const struct ColorCount *)c2;
  if (color_count1->count > color_count2->count) return -1;
  if (color_count1->count < color_count2->count) return 1;
  if (color_count1->index < color_count2->index) return -1;
  return 1;
}